

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateVariableName(ExpressionTranslateContext *ctx,VariableData *variable)

{
  ScopeData *pSVar1;
  bool bVar2;
  char *pcVar3;
  InplaceStr name;
  InplaceStr local_38;
  InplaceStr local_28;
  
  local_28.begin = "this";
  local_28.end = "";
  bVar2 = InplaceStr::operator==(&variable->name->name,&local_28);
  if (bVar2) {
    Print(ctx,"__context");
  }
  else {
    pcVar3 = (variable->name->name).begin;
    if (*pcVar3 == '$') {
      Print(ctx,"__");
      InplaceStr::InplaceStr(&local_38,(variable->name->name).begin + 1,(variable->name->name).end);
      pcVar3 = local_38.begin;
    }
    else {
      local_38.end = (variable->name->name).end;
    }
    name.end = local_38.end;
    name.begin = pcVar3;
    PrintEscapedName(ctx,name);
    pSVar1 = variable->scope;
    if ((((pSVar1 != ctx->ctx->globalScope) && (pSVar1->ownerType == (TypeBase *)0x0)) &&
        (pSVar1->ownerFunction == (FunctionData *)0x0)) &&
       (pSVar1->ownerNamespace == (NamespaceData *)0x0)) {
      Print(ctx,"_%d",(ulong)variable->uniqueId);
    }
  }
  return;
}

Assistant:

void TranslateVariableName(ExpressionTranslateContext &ctx, VariableData *variable)
{
	if(variable->name->name == InplaceStr("this"))
	{
		Print(ctx, "__context");
	}
	else
	{
		if(*variable->name->name.begin == '$')
		{
			Print(ctx, "__");

			PrintEscapedName(ctx, InplaceStr(variable->name->name.begin + 1, variable->name->name.end));
		}
		else
		{
			PrintEscapedName(ctx, variable->name->name);
		}

		if(variable->scope != ctx.ctx.globalScope && !variable->scope->ownerType && !variable->scope->ownerFunction && !variable->scope->ownerNamespace)
			Print(ctx, "_%d", variable->uniqueId);
	}
}